

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

int context_push(context_t *ctx,yajl_val v)

{
  stack_elem_t *psVar1;
  int iVar2;
  
  psVar1 = (stack_elem_t *)calloc(1,0x18);
  if (psVar1 == (stack_elem_t *)0x0) {
    iVar2 = 0xc;
    if (ctx->errbuf != (char *)0x0) {
      snprintf(ctx->errbuf,ctx->errbuf_size,"Out of memory");
    }
  }
  else {
    psVar1->value = v;
    psVar1->next = ctx->stack;
    ctx->stack = psVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int context_push(context_t *ctx, yajl_val v)
{
    stack_elem_t *stack;

    stack = malloc (sizeof (*stack));
    if (stack == NULL)
        RETURN_ERROR (ctx, ENOMEM, "Out of memory");
    memset (stack, 0, sizeof (*stack));

    assert ((ctx->stack == NULL)
            || YAJL_IS_OBJECT (v)
            || YAJL_IS_ARRAY (v));

    stack->value = v;
    stack->next = ctx->stack;
    ctx->stack = stack;

    return (0);
}